

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

void stbtt__handle_clipped_edge
               (float *scanline,int x,stbtt__active_edge *e,float x0,float y0,float x1,float y1)

{
  bool bVar1;
  float local_30;
  float local_2c;
  float y1_local;
  float x1_local;
  float y0_local;
  float x0_local;
  stbtt__active_edge *e_local;
  int x_local;
  float *scanline_local;
  
  if ((y0 != y1) || (NAN(y0) || NAN(y1))) {
    if (y1 <= y0) {
      __assert_fail("y0 < y1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                    ,0xb68,
                    "void stbtt__handle_clipped_edge(float *, int, stbtt__active_edge *, float, float, float, float)"
                   );
    }
    if (e->ey < e->sy) {
      __assert_fail("e->sy <= e->ey",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                    ,0xb69,
                    "void stbtt__handle_clipped_edge(float *, int, stbtt__active_edge *, float, float, float, float)"
                   );
    }
    if ((y0 < e->ey || y0 == e->ey) && (e->sy <= y1)) {
      y1_local = y0;
      x1_local = x0;
      if (y0 < e->sy) {
        x1_local = ((x1 - x0) * (e->sy - y0)) / (y1 - y0) + x0;
        y1_local = e->sy;
      }
      local_30 = y1;
      local_2c = x1;
      if (e->ey <= y1 && y1 != e->ey) {
        local_2c = ((x1 - x1_local) * (e->ey - y1)) / (y1 - y1_local) + x1;
        local_30 = e->ey;
      }
      if ((x1_local != (float)x) || (NAN(x1_local) || NAN((float)x))) {
        if ((x1_local != (float)(x + 1)) || (NAN(x1_local) || NAN((float)(x + 1)))) {
          if ((float)x < x1_local) {
            if (x1_local < (float)(x + 1)) {
              if (local_2c < (float)x || (float)(x + 1) < local_2c) {
                __assert_fail("x1 >= x && x1 <= x+1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                              ,0xb7e,
                              "void stbtt__handle_clipped_edge(float *, int, stbtt__active_edge *, float, float, float, float)"
                             );
              }
            }
            else if (local_2c < (float)(x + 1)) {
              __assert_fail("x1 >= x+1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                            ,0xb7c,
                            "void stbtt__handle_clipped_edge(float *, int, stbtt__active_edge *, float, float, float, float)"
                           );
            }
          }
          else if ((float)x < local_2c) {
            __assert_fail("x1 <= x",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                          ,0xb7a,
                          "void stbtt__handle_clipped_edge(float *, int, stbtt__active_edge *, float, float, float, float)"
                         );
          }
        }
        else if (local_2c < (float)x) {
          __assert_fail("x1 >= x",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                        ,0xb78,
                        "void stbtt__handle_clipped_edge(float *, int, stbtt__active_edge *, float, float, float, float)"
                       );
        }
      }
      else if ((float)(x + 1) < local_2c) {
        __assert_fail("x1 <= x+1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                      ,0xb76,
                      "void stbtt__handle_clipped_edge(float *, int, stbtt__active_edge *, float, float, float, float)"
                     );
      }
      if (((float)x < x1_local) || ((float)x < local_2c)) {
        if ((x1_local < (float)(x + 1)) || (local_2c < (float)(x + 1))) {
          bVar1 = false;
          if ((((float)x <= x1_local) && (bVar1 = false, x1_local <= (float)(x + 1))) &&
             (bVar1 = false, (float)x <= local_2c)) {
            bVar1 = local_2c <= (float)(x + 1);
          }
          if (!bVar1) {
            __assert_fail("x0 >= x && x0 <= x+1 && x1 >= x && x1 <= x+1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                          ,0xb85,
                          "void stbtt__handle_clipped_edge(float *, int, stbtt__active_edge *, float, float, float, float)"
                         );
          }
          scanline[x] = e->direction * (local_30 - y1_local) *
                        (1.0 - ((x1_local - (float)x) + (local_2c - (float)x)) / 2.0) + scanline[x];
        }
      }
      else {
        scanline[x] = e->direction * (local_30 - y1_local) + scanline[x];
      }
    }
  }
  return;
}

Assistant:

static void stbtt__handle_clipped_edge(float *scanline, int x, stbtt__active_edge *e, float x0, float y0, float x1, float y1)
{
   if (y0 == y1) return;
   STBTT_assert(y0 < y1);
   STBTT_assert(e->sy <= e->ey);
   if (y0 > e->ey) return;
   if (y1 < e->sy) return;
   if (y0 < e->sy) {
      x0 += (x1-x0) * (e->sy - y0) / (y1-y0);
      y0 = e->sy;
   }
   if (y1 > e->ey) {
      x1 += (x1-x0) * (e->ey - y1) / (y1-y0);
      y1 = e->ey;
   }

   if (x0 == x)
      STBTT_assert(x1 <= x+1);
   else if (x0 == x+1)
      STBTT_assert(x1 >= x);
   else if (x0 <= x)
      STBTT_assert(x1 <= x);
   else if (x0 >= x+1)
      STBTT_assert(x1 >= x+1);
   else
      STBTT_assert(x1 >= x && x1 <= x+1);

   if (x0 <= x && x1 <= x)
      scanline[x] += e->direction * (y1-y0);
   else if (x0 >= x+1 && x1 >= x+1)
      ;
   else {
      STBTT_assert(x0 >= x && x0 <= x+1 && x1 >= x && x1 <= x+1);
      scanline[x] += e->direction * (y1-y0) * (1-((x0-x)+(x1-x))/2); // coverage = 1 - average x position
   }
}